

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarIntG8IU.h
# Opt level: O3

void __thiscall
FastPForLib::VarIntG8IU::encodeArray
          (VarIntG8IU *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uchar *dst;
  size_t srclength;
  uint32_t *src;
  uint32_t *local_48;
  size_t local_40;
  uint32_t *local_38;
  
  local_40 = length << 2;
  sVar1 = *nvalue;
  *nvalue = sVar1 << 2;
  local_48 = out;
  if (sVar1 << 2 < 9 || local_40 == 0) {
    uVar4 = 0;
  }
  else {
    lVar3 = 0;
    local_38 = in;
    do {
      iVar2 = encodeBlock(this,&local_38,&local_40,(uchar **)&local_48,nvalue);
      lVar3 = iVar2 + lVar3;
      if (local_40 == 0) break;
    } while (8 < *nvalue);
    uVar4 = lVar3 + 3U >> 2;
  }
  *nvalue = uVar4;
  for (; local_48 < out + uVar4; local_48 = (uint32_t *)((long)local_48 + 1)) {
    *(undefined1 *)local_48 = 0;
    uVar4 = *nvalue;
  }
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) {
    const uint32_t *src = in;
    size_t srclength = length * 4;

    unsigned char *dst = reinterpret_cast<unsigned char *>(out);
    nvalue = nvalue * 4;

    size_t compressed_size = 0;
    while (srclength > 0 && nvalue >= 9) {
      compressed_size += encodeBlock(src, srclength, dst, nvalue);
    }
    // Output might not be a multiple of 4 so we make it so
    nvalue = ((compressed_size + 3) / 4);
    while (dst < reinterpret_cast<unsigned char*>(out + nvalue)) {
      *dst++ = 0; // clear padding bytes
    }
  }